

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMakeByteArrayNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t array;
  size_t slotCount;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  ulong local_b8;
  size_t i;
  size_t expressionCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_779576b2 gcFrame;
  sysbvm_astMakeByteArrayNode_t **tupleNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  expressionCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
  array = *(sysbvm_tuple_t *)(*arguments + 0x28);
  slotCount = sysbvm_array_getSize(array);
  if ((slotCount == 0) && (*(long *)(*arguments + 0x20) != 0)) {
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)*arguments;
  }
  else {
    gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
    sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
    gcFrameRecord.roots[3] = sVar1;
    sVar1 = sysbvm_array_create(context,slotCount);
    for (local_b8 = 0; local_b8 < slotCount; local_b8 = local_b8 + 1) {
      sVar2 = sysbvm_array_at(array,local_b8);
      sVar2 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                        (context,sVar2,arguments[1]);
      sysbvm_array_atPut(sVar1,local_b8,sVar2);
    }
    gcFrameRecord.roots[4] = (context->roots).byteArrayType;
    gcFrameRecord.roots[5] = sVar1;
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&expressionCount);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
    context_local = (sysbvm_context_t *)gcFrameRecord.roots;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMakeByteArrayNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astMakeByteArrayNode_t **tupleNode = (sysbvm_astMakeByteArrayNode_t**)node;

    struct {
        sysbvm_astMakeByteArrayNode_t *analyzedTupleNode;
        sysbvm_tuple_t expressions;
        sysbvm_tuple_t analyzedExpressions;
        sysbvm_tuple_t expression;
        sysbvm_tuple_t analyzedExpression;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*tupleNode)->super.sourcePosition);

    gcFrame.expressions = (*tupleNode)->elements;
    size_t expressionCount = sysbvm_array_getSize(gcFrame.expressions);
    if(expressionCount == 0 && (*tupleNode)->super.analyzedType)
    {
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return *node;
    }

    gcFrame.analyzedTupleNode = (sysbvm_astMakeByteArrayNode_t *)sysbvm_context_shallowCopy(context, *node);
    gcFrame.analyzedTupleNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    
    gcFrame.analyzedExpressions = sysbvm_array_create(context, expressionCount);
    for(size_t i = 0; i < expressionCount; ++i)
    {
        gcFrame.expression = sysbvm_array_at(gcFrame.expressions, i);
        gcFrame.analyzedExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.expression, *environment);
        sysbvm_array_atPut(gcFrame.analyzedExpressions, i, gcFrame.analyzedExpression);
    }

    gcFrame.analyzedTupleNode->super.analyzedType = context->roots.byteArrayType;
    gcFrame.analyzedTupleNode->elements = gcFrame.analyzedExpressions;
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedTupleNode;
}